

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatinbuilder.cpp
# Opt level: O3

UBool __thiscall
icu_63::CollationFastLatinBuilder::getCEsFromContractionCE32
          (CollationFastLatinBuilder *this,CollationData *data,uint32_t ce32,UErrorCode *errorCode)

{
  UChar *pUVar1;
  char16_t cVar2;
  UErrorCode UVar3;
  bool bVar4;
  bool bVar5;
  UBool UVar6;
  undefined4 uVar7;
  int64_t cce1;
  int64_t cce0;
  uint x;
  undefined4 uVar8;
  undefined8 uVar9;
  Iterator suffixes;
  uint local_d4;
  ConstChar16Ptr local_d0;
  CollationData *local_c8;
  ulong local_c0;
  UChar *local_b8;
  Iterator local_a8;
  
  if (U_ZERO_ERROR < *errorCode) {
    return '\0';
  }
  pUVar1 = data->contexts + (ce32 >> 0xd);
  local_c0 = (ulong)(this->contractionCEs).count;
  local_c8 = data;
  UVar6 = getCEsFromCE32(this,data,-1,CONCAT22(*pUVar1,pUVar1[1]),errorCode);
  if (UVar6 == '\0') {
    cce0 = 0x101000100;
    cce1 = 0;
  }
  else {
    cce0 = this->ce0;
    cce1 = this->ce1;
  }
  addContractionEntry(this,0x1ff,cce0,cce1,errorCode);
  local_d0.p_ = pUVar1 + 2;
  UCharsTrie::Iterator::Iterator(&local_a8,&local_d0,0,errorCode);
  local_b8 = local_d0.p_;
  local_d4 = 0xffffffff;
  bVar4 = false;
LAB_00247850:
  bVar4 = !bVar4;
LAB_00247857:
  do {
    UVar6 = UCharsTrie::Iterator::next(&local_a8,errorCode);
    if (UVar6 == '\0') {
      if (!bVar4) {
        addContractionEntry(this,local_d4,this->ce0,this->ce1,errorCode);
      }
      UVar3 = *errorCode;
      if (UVar3 < U_ILLEGAL_ARGUMENT_ERROR) {
        this->ce0 = local_c0 | 0x180000000;
        this->ce1 = 0;
      }
      UCharsTrie::Iterator::~Iterator(&local_a8);
      return UVar3 < U_ILLEGAL_ARGUMENT_ERROR;
    }
    uVar7 = (int)local_a8.str_.fUnion.fStackFields.fLengthAndFlags >> 5;
    uVar8 = uVar7;
    if (local_a8.str_.fUnion.fStackFields.fLengthAndFlags < 0) {
      uVar8 = local_a8.str_.fUnion.fFields.fLength;
    }
  } while (uVar8 == 0);
  uVar9 = local_a8.str_.fUnion.fStackFields.fBuffer;
  if (((int)local_a8.str_.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
    uVar9 = local_a8.str_.fUnion.fFields.fArray;
  }
  cVar2 = *(char16_t *)uVar9;
  x = (uint)(ushort)cVar2;
  if (0x17f < (ushort)cVar2) goto code_r0x0024789e;
  goto LAB_002478c5;
code_r0x0024789e:
  if ((ushort)cVar2 < 0x1e80 || (cVar2 & 0xffc0U) != 0x2000) goto LAB_00247857;
  x = (ushort)cVar2 - 0x1e80;
LAB_002478c5:
  if (x == local_d4) {
    bVar5 = !bVar4;
    bVar4 = true;
    if (bVar5) {
      addContractionEntry(this,local_d4,0x101000100,0,errorCode);
      bVar4 = true;
    }
    goto LAB_00247857;
  }
  if (!bVar4) {
    addContractionEntry(this,local_d4,this->ce0,this->ce1,errorCode);
    uVar7 = (int)local_a8.str_.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  if (local_a8.str_.fUnion.fStackFields.fLengthAndFlags < 0) {
    uVar7 = local_a8.str_.fUnion.fFields.fLength;
  }
  local_d4 = x;
  if (uVar7 == 1) {
    UVar6 = getCEsFromCE32(this,local_c8,-1,local_a8.value_,errorCode);
    bVar4 = true;
    if (UVar6 != '\0') goto LAB_00247850;
  }
  bVar4 = false;
  addContractionEntry(this,x,0x101000100,0,errorCode);
  goto LAB_00247850;
}

Assistant:

UBool
CollationFastLatinBuilder::getCEsFromContractionCE32(const CollationData &data, uint32_t ce32,
                                                     UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return FALSE; }
    const UChar *p = data.contexts + Collation::indexFromCE32(ce32);
    ce32 = CollationData::readCE32(p);  // Default if no suffix match.
    // Since the original ce32 is not a prefix mapping,
    // the default ce32 must not be another contraction.
    U_ASSERT(!Collation::isContractionCE32(ce32));
    int32_t contractionIndex = contractionCEs.size();
    if(getCEsFromCE32(data, U_SENTINEL, ce32, errorCode)) {
        addContractionEntry(CollationFastLatin::CONTR_CHAR_MASK, ce0, ce1, errorCode);
    } else {
        // Bail out for c-without-contraction.
        addContractionEntry(CollationFastLatin::CONTR_CHAR_MASK, Collation::NO_CE, 0, errorCode);
    }
    // Handle an encodable contraction unless the next contraction is too long
    // and starts with the same character.
    int32_t prevX = -1;
    UBool addContraction = FALSE;
    UCharsTrie::Iterator suffixes(p + 2, 0, errorCode);
    while(suffixes.next(errorCode)) {
        const UnicodeString &suffix = suffixes.getString();
        int32_t x = CollationFastLatin::getCharIndex(suffix.charAt(0));
        if(x < 0) { continue; }  // ignore anything but fast Latin text
        if(x == prevX) {
            if(addContraction) {
                // Bail out for all contractions starting with this character.
                addContractionEntry(x, Collation::NO_CE, 0, errorCode);
                addContraction = FALSE;
            }
            continue;
        }
        if(addContraction) {
            addContractionEntry(prevX, ce0, ce1, errorCode);
        }
        ce32 = (uint32_t)suffixes.getValue();
        if(suffix.length() == 1 && getCEsFromCE32(data, U_SENTINEL, ce32, errorCode)) {
            addContraction = TRUE;
        } else {
            addContractionEntry(x, Collation::NO_CE, 0, errorCode);
            addContraction = FALSE;
        }
        prevX = x;
    }
    if(addContraction) {
        addContractionEntry(prevX, ce0, ce1, errorCode);
    }
    if(U_FAILURE(errorCode)) { return FALSE; }
    // Note: There might not be any fast Latin contractions, but
    // we need to enter contraction handling anyway so that we can bail out
    // when there is a non-fast-Latin character following.
    // For example: Danish &Y<<u+umlaut, when we compare Y vs. u\u0308 we need to see the
    // following umlaut and bail out, rather than return the difference of Y vs. u.
    ce0 = ((int64_t)Collation::NO_CE_PRIMARY << 32) | CONTRACTION_FLAG | contractionIndex;
    ce1 = 0;
    return TRUE;
}